

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O1

int sort_5_3::merge_sort_4(int *a,int low,int high)

{
  merge_sort_4(a,low,(high + low) / 2);
}

Assistant:

int merge_sort_4(int *a, int low, int high) {
        if (low < high) {
            int m = (low + high) / 2;
            merge_sort_4(a, low, m);
            merge_sort_4(a, m + 1, high);
            merge_4(a, low, high, m);
        }
    }